

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * slang::ast::PackedStructType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  Token *this;
  StructUnionMemberSyntax *pSVar1;
  SyntaxNode *syntax_00;
  long lVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar3;
  pointer ppFVar4;
  bool bVar5;
  bool bVar6;
  bitwidth_t bVar7;
  uint uVar8;
  SourceLocation this_00;
  Info *pIVar9;
  DeclaratorSyntax *pDVar10;
  Type *pTVar11;
  Diagnostic *pDVar12;
  SourceLocation SVar13;
  pointer ppSVar14;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar15;
  ulong uVar16;
  long lVar17;
  SourceRange SVar18;
  bool isSigned;
  iterator __begin3;
  FieldSymbol *field;
  ASTContext context;
  SmallVector<slang::ast::FieldSymbol_*,_5UL> members;
  bool local_129;
  SourceLocation local_128;
  Compilation *local_120;
  Token local_118;
  uint local_108 [2];
  StructUnionTypeSyntax *local_100;
  Scope *local_f8;
  FieldSymbol *local_f0;
  ASTContext *local_e8;
  pointer local_e0;
  pointer local_d8;
  Info *local_d0;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_c8;
  SourceLocation local_c0;
  string_view local_b8;
  ASTContext local_a8;
  SmallVectorBase<slang::ast::FieldSymbol_*> local_70 [2];
  
  local_129 = (syntax->signing).kind == SignedKeyword;
  local_70[0].data_ = (pointer)parsing::Token::location(&syntax->keyword);
  local_120 = comp;
  local_128 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::PackedStructType,slang::ast::Compilation&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                        (&comp->super_BumpAllocator,comp,&local_129,(SourceLocation *)local_70,
                         parentContext);
  *(StructUnionTypeSyntax **)((long)local_128 + 0x38) = syntax;
  local_f8 = (Scope *)((long)local_128 + 0x50);
  local_a8.flags.m_bits = (parentContext->flags).m_bits;
  SVar13 = (SourceLocation)&local_a8;
  local_a8.lookupIndex = 0xffffffff;
  local_a8.instanceOrProc = (Symbol *)0x0;
  local_a8.firstTempVar = (TempVarSymbol *)0x0;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_a8.randomizeDetails = (RandomizeDetails *)0x0;
  local_a8.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_70[0].cap = 5;
  ppSVar14 = (syntax->members).
             super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
  local_e0 = ppSVar14 +
             (syntax->members).
             super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
  bVar3 = false;
  local_100 = syntax;
  local_e8 = parentContext;
  local_a8.scope.ptr = local_f8;
  do {
    ppFVar4 = local_70[0].data_;
    if (ppSVar14 == local_e0) {
      if ((*(bitwidth_t *)((long)local_128 + 0x48) == 0) || (bVar3)) {
LAB_0027524f:
        pTVar11 = local_120->errorType;
      }
      else {
        uVar16 = 0;
        for (lVar17 = local_70[0].len << 3; lVar17 != 0; lVar17 = lVar17 + -8) {
          lVar2 = *(long *)((long)ppFVar4 + lVar17 + -8);
          *(ulong *)(lVar2 + 0x158) = uVar16;
          pTVar11 = DeclaredType::getType((DeclaredType *)(lVar2 + 0x40));
          bVar7 = Type::getBitWidth(pTVar11);
          uVar16 = (ulong)((int)uVar16 + bVar7);
        }
        SVar13 = local_128;
        pTVar11 = anon_unknown.dwarf_a81b74::createPackedDims
                            (local_e8,(Type *)local_128,&local_100->dimensions);
      }
      SmallVectorBase<slang::ast::FieldSymbol_*>::cleanup(local_70,(EVP_PKEY_CTX *)SVar13);
      return pTVar11;
    }
    pSVar1 = *ppSVar14;
    syntax_00 = (pSVar1->super_SyntaxNode).previewNode;
    local_d8 = ppSVar14;
    if (syntax_00 != (SyntaxNode *)0x0) {
      Scope::addMembers(local_f8,syntax_00);
    }
    SVar13 = (SourceLocation)(pSVar1->type).ptr;
    this_00 = (SourceLocation)
              Compilation::getType(local_120,(DataTypeSyntax *)SVar13,&local_a8,(Type *)0x0);
    bVar5 = Type::isFourState((Type *)this_00);
    *(bool *)((long)local_128 + 0x4d) = (bool)(*(bool *)((long)local_128 + 0x4d) | bVar5);
    bVar6 = Type::isError((Type *)this_00);
    bVar5 = !bVar3;
    bVar3 = true;
    if (bVar5 && !bVar6) {
      bVar5 = Type::isIntegral((Type *)this_00);
      if (bVar5) {
        bVar3 = false;
      }
      else {
        local_118 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(pSVar1->type).ptr);
        SVar13 = parsing::Token::location(&local_118);
        pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0009,SVar13);
        ast::operator<<(pDVar12,(Type *)this_00);
        SVar18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(pSVar1->type).ptr);
        SVar13 = SVar18.startLoc;
        Diagnostic::operator<<(pDVar12,SVar18);
      }
    }
    local_c8 = &pSVar1->declarators;
    local_118.info = (Info *)0x0;
    local_118._0_8_ = local_c8;
    local_d0 = (Info *)((pSVar1->declarators).elements._M_extent._M_extent_value + 1 >> 1);
    pIVar9 = (Info *)0x0;
    pSVar15 = local_c8;
    while ((pSVar15 != local_c8 || (pIVar9 != local_d0))) {
      pDVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference
                          ((iterator_base<slang::syntax::DeclaratorSyntax_*> *)&local_118);
      this = &pDVar10->name;
      local_b8 = parsing::Token::valueText(this);
      local_c0 = parsing::Token::location(this);
      local_108[1] = 0;
      local_108[0] = (uint)local_70[0].len;
      local_f0 = BumpAllocator::
                 emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                           (&local_120->super_BumpAllocator,&local_b8,&local_c0,local_108 + 1,
                            local_108);
      (local_f0->super_VariableSymbol).super_ValueSymbol.declaredType.type = (Type *)this_00;
      (local_f0->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax =
           &pDVar10->super_SyntaxNode;
      syntax_01._M_ptr =
           (pSVar1->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_01._M_extent._M_extent_value =
           (pSVar1->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)local_f0,local_a8.scope.ptr,syntax_01);
      Scope::addMember(local_f8,(Symbol *)local_f0);
      SmallVectorBase<slang::ast::FieldSymbol*>::emplace_back<slang::ast::FieldSymbol*const&>
                ((SmallVectorBase<slang::ast::FieldSymbol*> *)local_70,&local_f0);
      SVar13 = this_00;
      pTVar11 = Compilation::getType(local_120,(Type *)this_00,&pDVar10->dimensions,&local_a8);
      bVar5 = Type::isUnpackedArray(pTVar11);
      if ((bVar5) && (!bVar3)) {
        SVar18 = parsing::Token::range(this);
        pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0009,SVar18);
        ast::operator<<(pDVar12,pTVar11);
        SVar18 = slang::syntax::SyntaxNode::sourceRange
                           (&(pDVar10->dimensions).super_SyntaxListBase.super_SyntaxNode);
        SVar13 = SVar18.startLoc;
        bVar3 = true;
        Diagnostic::operator<<(pDVar12,SVar18);
      }
      bVar7 = Type::getBitWidth((Type *)this_00);
      uVar8 = bVar7 + *(bitwidth_t *)((long)local_128 + 0x48);
      *(uint *)((long)local_128 + 0x48) = uVar8;
      if ((!bVar3) && (0xffffff < uVar8)) {
        SVar18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_100);
        pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1d0009,SVar18);
        pDVar12 = Diagnostic::operator<<<unsigned_int>
                            (pDVar12,*(bitwidth_t *)((long)local_128 + 0x48));
        SVar13 = (SourceLocation)0xffffff;
        Diagnostic::operator<<<unsigned_int>(pDVar12,0xffffff);
        goto LAB_0027524f;
      }
      if (pDVar10->initializer != (EqualsValueClauseSyntax *)0x0) {
        SVar13 = parsing::Token::location(&pDVar10->initializer->equals);
        pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1b0009,SVar13);
        SVar18 = slang::syntax::SyntaxNode::sourceRange
                           (&((pDVar10->initializer->expr).ptr)->super_SyntaxNode);
        SVar13 = SVar18.startLoc;
        Diagnostic::operator<<(pDVar12,SVar18);
      }
      pIVar9 = (Info *)((long)&(local_118.info)->rawTextPtr + 1);
      local_118.info = pIVar9;
      pSVar15 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)local_118._0_8_;
    }
    ppSVar14 = local_d8 + 1;
  } while( true );
}

Assistant:

const Type& PackedStructType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                         const ASTContext& parentContext) {
    SLANG_ASSERT(syntax.packed);
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    bool issuedError = false;

    auto structType = comp.emplace<PackedStructType>(comp, isSigned, syntax.keyword.location(),
                                                     parentContext);
    structType->setSyntax(syntax);

    ASTContext context(*structType, LookupLocation::max, parentContext.flags);

    SmallVector<FieldSymbol*> members;
    for (auto member : syntax.members) {
        if (member->previewNode)
            structType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        structType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral()) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   0u, (uint32_t)members.size());
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            structType->addMember(*field);
            members.push_back(field);

            // Unpacked arrays are disallowed in packed structs.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            structType->bitWidth += type.getBitWidth();
            if (!issuedError && structType->bitWidth > (uint32_t)SVInt::MAX_BITS) {
                context.addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                    << structType->bitWidth << (uint32_t)SVInt::MAX_BITS;
                return comp.getErrorType();
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    if (!structType->bitWidth || issuedError)
        return comp.getErrorType();

    // We added the fields in reverse order, so compute their actual
    // offsets in the right order now.
    bitwidth_t offset = 0;
    for (auto member : std::views::reverse(members)) {
        member->bitOffset = offset;
        offset += member->getType().getBitWidth();
    }

    return createPackedDims(parentContext, structType, syntax.dimensions);
}